

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall
Js::ScriptContextPolymorphicInlineCache::Finalize
          (ScriptContextPolymorphicInlineCache *this,bool isShutdown)

{
  size_t *psVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint count;
  byte *buffer;
  long lVar8;
  
  if ((this->super_PolymorphicInlineCache).size == 0) {
    if ((this->super_PolymorphicInlineCache).inlineCaches != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x41e,"(!inlineCaches)","!inlineCaches");
      if (!bVar4) {
LAB_00984120:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  else if ((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr !=
           (ScriptContext *)0x0) {
    if ((this->super_PolymorphicInlineCache).inlineCaches == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x42a,"(inlineCaches && size > 0)","inlineCaches && size > 0");
      if (!bVar4) goto LAB_00984120;
      *puVar6 = 0;
    }
    TVar2 = (this->super_PolymorphicInlineCache).size;
    if (isShutdown) {
      if (TVar2 != 0) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          buffer = (byte *)((long)&((this->super_PolymorphicInlineCache).inlineCaches)->u + lVar8);
          bVar4 = Memory::IsAll(buffer,0x20,'\0');
          if (!bVar4) {
            buffer[0x10] = '\0';
            buffer[0x11] = '\0';
            buffer[0x12] = '\0';
            buffer[0x13] = '\0';
            buffer[0x14] = '\0';
            buffer[0x15] = '\0';
            buffer[0x16] = '\0';
            buffer[0x17] = '\0';
            buffer[0x18] = '\0';
            buffer[0x19] = '\0';
            buffer[0x1a] = '\0';
            buffer[0x1b] = '\0';
            buffer[0x1c] = '\0';
            buffer[0x1d] = '\0';
            buffer[0x1e] = '\0';
            buffer[0x1f] = '\0';
            buffer[0] = '\0';
            buffer[1] = '\0';
            buffer[2] = '\0';
            buffer[3] = '\0';
            buffer[4] = '\0';
            buffer[5] = '\0';
            buffer[6] = '\0';
            buffer[7] = '\0';
            buffer[8] = '\0';
            buffer[9] = '\0';
            buffer[10] = '\0';
            buffer[0xb] = '\0';
            buffer[0xc] = '\0';
            buffer[0xd] = '\0';
            buffer[0xe] = '\0';
            buffer[0xf] = '\0';
          }
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar7 < (this->super_PolymorphicInlineCache).size);
      }
      count = 0;
    }
    else {
      if (TVar2 == 0) {
        count = 0;
        uVar5 = 0;
      }
      else {
        lVar8 = 0;
        uVar7 = 0;
        count = 0;
        do {
          bVar4 = InlineCache::RemoveFromInvalidationList
                            ((InlineCache *)
                             ((long)&((this->super_PolymorphicInlineCache).inlineCaches)->u + lVar8)
                            );
          count = count + bVar4;
          uVar7 = uVar7 + 1;
          uVar5 = (this->super_PolymorphicInlineCache).size;
          lVar8 = lVar8 + 0x20;
        } while (uVar7 < uVar5);
      }
      Memory::DeleteArray<Memory::InlineCacheAllocator,Js::InlineCache>
                (&((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                  ->inlineCacheAllocator,(ulong)uVar5,
                 (this->super_PolymorphicInlineCache).inlineCaches);
      psVar1 = &(((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                ->inlineCacheAllocator).polyCacheAllocSize;
      *psVar1 = *psVar1 + (ulong)(this->super_PolymorphicInlineCache).size * -0x20;
    }
    (this->super_PolymorphicInlineCache).inlineCaches = (Type)0x0;
    (this->super_PolymorphicInlineCache).size = 0;
    if (count != 0) {
      ThreadContext::NotifyInlineCacheBatchUnregistered
                (((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                 ->threadContext,count);
      return;
    }
  }
  return;
}

Assistant:

void ScriptContextPolymorphicInlineCache::Finalize(bool isShutdown)
    {
        if (size == 0)
        {
            // Already finalized
            Assert(!inlineCaches);
            return;
        }
        if (this->javascriptLibrary->scriptContext == nullptr)
        {
            // If caches were made during ScriptContext initialization, and initialization failed the ScriptContext
            // and InlineCacheAllocator will be freed, so we don't need to do anything during finalization
            return;
        }

        uint unregisteredInlineCacheCount = 0;

        Assert(inlineCaches && size > 0);

        // If we're not shutting down (as in closing the script context), we need to remove our inline caches from
        // thread context's invalidation lists, and release memory back to the arena.  During script context shutdown,
        // we leave everything in place, because the inline cache arena will stay alive until script context is destroyed
        // (as in destructor has been called) and thus the invalidation lists are safe to keep references to caches from this
        // script context.  We will, however, zero all inline caches so that we don't have to process them on subsequent
        // collections, which may still happen from other script contexts.
        if (isShutdown)
        {
#if DBG
            for (int i = 0; i < size; i++)
            {
                inlineCaches[i].Clear();
            }
#else
            memset(inlineCaches, 0, size * sizeof(InlineCache));
#endif
        }
        else
        {
            for (int i = 0; i < size; i++)
            {
                if (inlineCaches[i].RemoveFromInvalidationList())
                {
                    unregisteredInlineCacheCount++;
                }
            }
            AllocatorDeleteArray(InlineCacheAllocator, this->javascriptLibrary->scriptContext->GetInlineCacheAllocator(), size, inlineCaches);
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            this->javascriptLibrary->scriptContext->GetInlineCacheAllocator()->LogPolyCacheFree(size * sizeof(InlineCache));
#endif
        }

        inlineCaches = nullptr;
        size = 0;
        if (unregisteredInlineCacheCount > 0)
        {
            this->javascriptLibrary->scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }
    }